

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_reinit_(event_base *base)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_18;
  int result;
  
  uStack_18 = (ulong)in_EAX;
  evmap_io_foreach_fd(base,evmap_io_reinit_iter_fn,&result);
  if ((long)uStack_18 < 0) {
    iVar1 = -1;
  }
  else {
    evmap_signal_foreach_signal(base,evmap_signal_reinit_iter_fn,&result);
    iVar1 = result >> 0x1f;
  }
  return iVar1;
}

Assistant:

int
evmap_reinit_(struct event_base *base)
{
	int result = 0;

	evmap_io_foreach_fd(base, evmap_io_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	evmap_signal_foreach_signal(base, evmap_signal_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	return 0;
}